

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::DiscMiMBIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  ulong uVar13;
  RTCIntersectArguments *pRVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar41;
  float fVar42;
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [64];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  int local_13c;
  undefined1 local_138 [16];
  float local_128;
  float local_124;
  float local_120;
  undefined4 local_11c;
  undefined4 local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  RTCFilterFunctionNArguments local_f8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar33 [64];
  
  pSVar6 = context->scene;
  uVar13 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) / ((pGVar7->time_range).upper - fVar1)
          );
  auVar27 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar27 = vminss_avx(auVar27,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar27 = vmaxss_avx(ZEXT816(0) << 0x20,auVar27);
  fVar1 = fVar1 - auVar27._0_4_;
  lVar15 = *(long *)&pGVar7[2].numPrimitives;
  lVar16 = (long)(int)auVar27._0_4_ * 0x38;
  lVar8 = *(long *)(lVar15 + lVar16);
  lVar9 = *(long *)(lVar15 + 0x10 + lVar16);
  auVar27 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar13);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar28 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar17);
  uVar18 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar40 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar18);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar31 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar19);
  auVar29 = vunpcklps_avx(auVar27,auVar40);
  auVar25 = vunpckhps_avx(auVar27,auVar40);
  auVar27 = vunpcklps_avx(auVar28,auVar31);
  auVar26 = vunpckhps_avx(auVar28,auVar31);
  auVar30 = vunpcklps_avx(auVar29,auVar27);
  auVar29 = vunpckhps_avx(auVar29,auVar27);
  auVar58 = vunpcklps_avx(auVar25,auVar26);
  lVar8 = *(long *)(lVar15 + 0x38 + lVar16);
  lVar15 = *(long *)(lVar15 + 0x48 + lVar16);
  auVar27 = *(undefined1 (*) [16])(lVar8 + uVar13 * lVar15);
  auVar28 = *(undefined1 (*) [16])(lVar8 + uVar17 * lVar15);
  auVar40 = *(undefined1 (*) [16])(lVar8 + uVar18 * lVar15);
  auVar31 = *(undefined1 (*) [16])(lVar8 + lVar15 * uVar19);
  auVar59 = vunpcklps_avx(auVar27,auVar40);
  auVar34 = vunpckhps_avx(auVar27,auVar40);
  auVar27 = vunpcklps_avx(auVar28,auVar31);
  auVar35 = vunpckhps_avx(auVar28,auVar31);
  auVar31 = vunpcklps_avx(auVar59,auVar27);
  auVar40 = vunpckhps_avx(auVar59,auVar27);
  auVar59 = vunpcklps_avx(auVar34,auVar35);
  auVar27 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar28 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  auVar57._8_4_ = 0x3f800000;
  auVar57._0_8_ = 0x3f8000003f800000;
  auVar57._12_4_ = 0x3f800000;
  fVar22 = auVar27._0_4_;
  fVar23 = auVar27._4_4_;
  fVar24 = auVar27._8_4_;
  fVar44 = auVar27._12_4_;
  fVar49 = auVar28._0_4_;
  fVar50 = auVar28._4_4_;
  fVar51 = auVar28._8_4_;
  fVar52 = auVar28._12_4_;
  auVar27._0_4_ = fVar49 * auVar30._0_4_ + fVar22 * auVar31._0_4_;
  auVar27._4_4_ = fVar50 * auVar30._4_4_ + fVar23 * auVar31._4_4_;
  auVar27._8_4_ = fVar51 * auVar30._8_4_ + fVar24 * auVar31._8_4_;
  auVar27._12_4_ = fVar52 * auVar30._12_4_ + fVar44 * auVar31._12_4_;
  auVar31._0_4_ = fVar22 * auVar40._0_4_ + fVar49 * auVar29._0_4_;
  auVar31._4_4_ = fVar23 * auVar40._4_4_ + fVar50 * auVar29._4_4_;
  auVar31._8_4_ = fVar24 * auVar40._8_4_ + fVar51 * auVar29._8_4_;
  auVar31._12_4_ = fVar44 * auVar40._12_4_ + fVar52 * auVar29._12_4_;
  auVar30._0_4_ = fVar22 * auVar59._0_4_ + fVar49 * auVar58._0_4_;
  auVar30._4_4_ = fVar23 * auVar59._4_4_ + fVar50 * auVar58._4_4_;
  auVar30._8_4_ = fVar24 * auVar59._8_4_ + fVar51 * auVar58._8_4_;
  auVar30._12_4_ = fVar44 * auVar59._12_4_ + fVar52 * auVar58._12_4_;
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar12 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar40._4_4_ = uVar12;
  auVar40._0_4_ = uVar12;
  auVar40._8_4_ = uVar12;
  auVar40._12_4_ = uVar12;
  auVar40 = vsubps_avx(auVar27,auVar40);
  uVar12 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar28._4_4_ = uVar12;
  auVar28._0_4_ = uVar12;
  auVar28._8_4_ = uVar12;
  auVar28._12_4_ = uVar12;
  auVar31 = vsubps_avx(auVar31,auVar28);
  uVar12 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar29._4_4_ = uVar12;
  auVar29._0_4_ = uVar12;
  auVar29._8_4_ = uVar12;
  auVar29._12_4_ = uVar12;
  auVar29 = vsubps_avx(auVar30,auVar29);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar20 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar39 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar41 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar27 = ZEXT416((uint)(fVar41 * fVar41 + fVar39 * fVar39 + fVar20 * fVar20));
  auVar28 = vshufps_avx(auVar27,auVar27,0);
  auVar27 = vrcpps_avx(auVar28);
  fVar20 = auVar27._0_4_;
  auVar59._0_4_ = fVar20 * auVar28._0_4_;
  fVar62 = auVar27._4_4_;
  auVar59._4_4_ = fVar62 * auVar28._4_4_;
  fVar63 = auVar27._8_4_;
  auVar59._8_4_ = fVar63 * auVar28._8_4_;
  fVar64 = auVar27._12_4_;
  auVar59._12_4_ = fVar64 * auVar28._12_4_;
  auVar27 = vsubps_avx(auVar57,auVar59);
  fVar53 = auVar29._0_4_;
  fVar54 = auVar29._4_4_;
  fVar55 = auVar29._8_4_;
  fVar56 = auVar29._12_4_;
  fVar45 = auVar31._0_4_;
  fVar46 = auVar31._4_4_;
  fVar47 = auVar31._8_4_;
  fVar48 = auVar31._12_4_;
  fVar39 = auVar40._0_4_;
  fVar41 = auVar40._4_4_;
  fVar42 = auVar40._8_4_;
  fVar43 = auVar40._12_4_;
  local_98._0_4_ =
       (fVar39 * fVar1 + fVar45 * fVar2 + fVar53 * fVar3) * (fVar20 + fVar20 * auVar27._0_4_);
  local_98._4_4_ =
       (fVar41 * fVar1 + fVar46 * fVar2 + fVar54 * fVar3) * (fVar62 + fVar62 * auVar27._4_4_);
  local_98._8_4_ =
       (fVar42 * fVar1 + fVar47 * fVar2 + fVar55 * fVar3) * (fVar63 + fVar63 * auVar27._8_4_);
  local_98._12_4_ =
       (fVar43 * fVar1 + fVar48 * fVar2 + fVar56 * fVar3) * (fVar64 + fVar64 * auVar27._12_4_);
  auVar61 = ZEXT1664(local_98);
  uVar12 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar58._4_4_ = uVar12;
  auVar58._0_4_ = uVar12;
  auVar58._8_4_ = uVar12;
  auVar58._12_4_ = uVar12;
  auVar27 = vcmpps_avx(auVar58,local_98,2);
  fVar20 = (ray->super_RayK<1>).tfar;
  auVar60._4_4_ = fVar20;
  auVar60._0_4_ = fVar20;
  auVar60._8_4_ = fVar20;
  auVar60._12_4_ = fVar20;
  auVar28 = vcmpps_avx(local_98,auVar60,2);
  auVar27 = vandps_avx(auVar28,auVar27);
  auVar28 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar28 = vpcmpgtd_avx(auVar28,_DAT_01f7fcf0);
  auVar30 = auVar28 & auVar27;
  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar28);
    auVar28 = vunpckhps_avx(auVar25,auVar26);
    auVar25 = vunpckhps_avx(auVar34,auVar35);
    fVar20 = fVar49 * auVar28._0_4_ + fVar22 * auVar25._0_4_;
    fVar22 = fVar50 * auVar28._4_4_ + fVar23 * auVar25._4_4_;
    fVar23 = fVar51 * auVar28._8_4_ + fVar24 * auVar25._8_4_;
    fVar24 = fVar52 * auVar28._12_4_ + fVar44 * auVar25._12_4_;
    auVar25._0_4_ = local_98._0_4_ * fVar1;
    auVar25._4_4_ = local_98._4_4_ * fVar1;
    auVar25._8_4_ = local_98._8_4_ * fVar1;
    auVar25._12_4_ = local_98._12_4_ * fVar1;
    auVar34._0_4_ = local_98._0_4_ * fVar2;
    auVar34._4_4_ = local_98._4_4_ * fVar2;
    auVar34._8_4_ = local_98._8_4_ * fVar2;
    auVar34._12_4_ = local_98._12_4_ * fVar2;
    auVar38._0_4_ = local_98._0_4_ * fVar3;
    auVar38._4_4_ = local_98._4_4_ * fVar3;
    auVar38._8_4_ = local_98._8_4_ * fVar3;
    auVar38._12_4_ = local_98._12_4_ * fVar3;
    auVar28 = vsubps_avx(auVar40,auVar25);
    auVar40 = vsubps_avx(auVar31,auVar34);
    auVar31 = vsubps_avx(auVar29,auVar38);
    auVar35._0_4_ =
         auVar28._0_4_ * auVar28._0_4_ +
         auVar40._0_4_ * auVar40._0_4_ + auVar31._0_4_ * auVar31._0_4_;
    auVar35._4_4_ =
         auVar28._4_4_ * auVar28._4_4_ +
         auVar40._4_4_ * auVar40._4_4_ + auVar31._4_4_ * auVar31._4_4_;
    auVar35._8_4_ =
         auVar28._8_4_ * auVar28._8_4_ +
         auVar40._8_4_ * auVar40._8_4_ + auVar31._8_4_ * auVar31._8_4_;
    auVar35._12_4_ =
         auVar28._12_4_ * auVar28._12_4_ +
         auVar40._12_4_ * auVar40._12_4_ + auVar31._12_4_ * auVar31._12_4_;
    auVar26._0_4_ = fVar20 * fVar20;
    auVar26._4_4_ = fVar22 * fVar22;
    auVar26._8_4_ = fVar23 * fVar23;
    auVar26._12_4_ = fVar24 * fVar24;
    auVar28 = vcmpps_avx(auVar35,auVar26,2);
    auVar40 = auVar27 & auVar28;
    if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0')
    {
      auVar27 = vandps_avx(auVar27,auVar28);
      auVar36._0_4_ = fVar39 * fVar39 + fVar45 * fVar45 + fVar53 * fVar53;
      auVar36._4_4_ = fVar41 * fVar41 + fVar46 * fVar46 + fVar54 * fVar54;
      auVar36._8_4_ = fVar42 * fVar42 + fVar47 * fVar47 + fVar55 * fVar55;
      auVar36._12_4_ = fVar43 * fVar43 + fVar48 * fVar48 + fVar56 * fVar56;
      auVar28 = vcmpps_avx(auVar36,auVar26,6);
      auVar40 = auVar28 & auVar27;
      if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar40[0xf] < '\0'
         ) {
        auVar4._0_4_ = (ray->super_RayK<1>).tfar;
        auVar4._4_4_ = (ray->super_RayK<1>).mask;
        auVar4._8_4_ = (ray->super_RayK<1>).id;
        auVar4._12_4_ = (ray->super_RayK<1>).flags;
        auVar37 = ZEXT1664(auVar4);
        auVar27 = vandps_avx(auVar27,auVar28);
        local_b8 = ZEXT432(0) << 0x20;
        local_88[0] = -fVar1;
        local_88[1] = -fVar1;
        local_88[2] = -fVar1;
        local_88[3] = -fVar1;
        local_78[0] = -fVar2;
        local_78[1] = -fVar2;
        local_78[2] = -fVar2;
        local_78[3] = -fVar2;
        local_68[0] = -fVar3;
        local_68[1] = -fVar3;
        local_68[2] = -fVar3;
        local_68[3] = -fVar3;
        local_138 = auVar27;
        auVar32._8_4_ = 0x7f800000;
        auVar32._0_8_ = 0x7f8000007f800000;
        auVar32._12_4_ = 0x7f800000;
        auVar33 = ZEXT1664(auVar32);
        auVar28 = vblendvps_avx(auVar32,local_98,auVar27);
        auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar40 = vminps_avx(auVar40,auVar28);
        auVar31 = vshufpd_avx(auVar40,auVar40,1);
        auVar40 = vminps_avx(auVar31,auVar40);
        auVar28 = vcmpps_avx(auVar28,auVar40,0);
        auVar40 = auVar27 & auVar28;
        if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar40[0xf] < '\0') {
          auVar27 = vandps_avx(auVar28,auVar27);
        }
        uVar10 = vextractps_avx(auVar4,1);
        uVar11 = vmovmskps_avx(auVar27);
        lVar15 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        do {
          local_110 = *(uint *)(local_48 + lVar15 * 4);
          pRVar14 = (RTCIntersectArguments *)(ulong)local_110;
          pGVar7 = (pSVar6->geometries).items[(long)pRVar14].ptr;
          if ((pGVar7->mask & uVar10) == 0) {
            *(undefined4 *)(local_138 + lVar15 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar1 = *(float *)(local_b8 + lVar15 * 4);
              fVar2 = *(float *)(local_b8 + lVar15 * 4 + 0x10);
              (ray->super_RayK<1>).tfar = local_88[lVar15 + -4];
              (ray->Ng).field_0.field_0.x = local_88[lVar15];
              (ray->Ng).field_0.field_0.y = local_78[lVar15];
              (ray->Ng).field_0.field_0.z = local_68[lVar15];
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = (Disc->primIDs).field_0.i[lVar15];
              ray->geomID = local_110;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_58 = auVar37._0_16_;
            local_c8 = auVar61._0_16_;
            local_128 = local_88[lVar15];
            local_124 = local_78[lVar15];
            local_120 = local_68[lVar15];
            local_11c = *(undefined4 *)(local_b8 + lVar15 * 4);
            local_118 = *(undefined4 *)(local_b8 + lVar15 * 4 + 0x10);
            local_114 = (Disc->primIDs).field_0.i[lVar15];
            pRVar14 = (RTCIntersectArguments *)0x0;
            local_10c = context->user->instID[0];
            local_108 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = local_88[lVar15 + -4];
            local_13c = -1;
            local_f8.valid = &local_13c;
            local_f8.geometryUserPtr = pGVar7->userPtr;
            local_f8.context = context->user;
            local_f8.ray = (RTCRayN *)ray;
            local_f8.hit = (RTCHitN *)&local_128;
            local_f8.N = 1;
            if ((pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar7->intersectionFilterN)(&local_f8), *local_f8.valid != 0)) {
              pRVar14 = context->args;
              if ((pRVar14->filter != (RTCFilterFunctionN)0x0) &&
                 ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*pRVar14->filter)(&local_f8), *local_f8.valid == 0)))) goto LAB_00ee1f9d;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.x = *(float *)local_f8.hit;
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_f8.hit + 4);
              (((Vec3f *)((long)local_f8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_f8.hit + 8);
              *(float *)((long)local_f8.ray + 0x3c) = *(float *)(local_f8.hit + 0xc);
              *(float *)((long)local_f8.ray + 0x40) = *(float *)(local_f8.hit + 0x10);
              *(float *)((long)local_f8.ray + 0x44) = *(float *)(local_f8.hit + 0x14);
              *(float *)((long)local_f8.ray + 0x48) = *(float *)(local_f8.hit + 0x18);
              *(float *)((long)local_f8.ray + 0x4c) = *(float *)(local_f8.hit + 0x1c);
              pRVar14 = (RTCIntersectArguments *)0x0;
              *(float *)((long)local_f8.ray + 0x50) = *(float *)(local_f8.hit + 0x20);
            }
            else {
LAB_00ee1f9d:
              (ray->super_RayK<1>).tfar = (float)local_58._0_4_;
            }
            auVar61 = ZEXT1664(local_c8);
            auVar33 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            *(undefined4 *)(local_138 + lVar15 * 4) = 0;
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar21._4_4_ = fVar1;
            auVar21._0_4_ = fVar1;
            auVar21._8_4_ = fVar1;
            auVar21._12_4_ = fVar1;
            auVar27 = vcmpps_avx(local_c8,auVar21,2);
            local_138 = vandps_avx(auVar27,local_138);
            auVar5._0_4_ = (ray->super_RayK<1>).tfar;
            auVar5._4_4_ = (ray->super_RayK<1>).mask;
            auVar5._8_4_ = (ray->super_RayK<1>).id;
            auVar5._12_4_ = (ray->super_RayK<1>).flags;
            auVar37 = ZEXT1664(auVar5);
            uVar10 = vextractps_avx(auVar5,1);
          }
          if ((((local_138 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_138 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_138 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_138[0xf]) {
            return;
          }
          auVar27 = vblendvps_avx(auVar33._0_16_,auVar61._0_16_,local_138);
          auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
          auVar28 = vminps_avx(auVar28,auVar27);
          auVar40 = vshufpd_avx(auVar28,auVar28,1);
          auVar28 = vminps_avx(auVar40,auVar28);
          auVar28 = vcmpps_avx(auVar27,auVar28,0);
          auVar40 = local_138 & auVar28;
          auVar27 = local_138;
          if ((((auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar40[0xf] < '\0') {
            auVar27 = vandps_avx(auVar28,local_138);
          }
          uVar12 = vmovmskps_avx(auVar27);
          uVar13 = CONCAT44((int)((ulong)pRVar14 >> 0x20),uVar12);
          lVar15 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }